

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.hpp
# Opt level: O2

bool __thiscall Map_Tile::Walkable(Map_Tile *this,bool npc)

{
  TileSpec TVar1;
  
  if ((this->warp).map != 0 && npc) {
    return false;
  }
  TVar1 = this->tilespec;
  if ((uint)TVar1 < 0x1d) {
    if ((0x1ff502ffU >> (TVar1 & Unknown7) & 1) != 0) {
      return false;
    }
    if (TVar1 == NPCBoundary) {
      return !npc;
    }
  }
  return true;
}

Assistant:

bool Walkable(bool npc = false) const
	{
		if (this->warp && npc)
		{
			return false;
		}

		switch (this->tilespec)
		{
			case Wall:
			case ChairDown:
			case ChairLeft:
			case ChairRight:
			case ChairUp:
			case ChairDownRight:
			case ChairUpLeft:
			case ChairAll:
			case Chest:
			case BankVault:
			case MapEdge:
			case Board1:
			case Board2:
			case Board3:
			case Board4:
			case Board5:
			case Board6:
			case Board7:
			case Board8:
			case Jukebox:
				return false;
			case NPCBoundary:
				return !npc;
			default:
				return true;
		}
	}